

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_fgetss(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_context *pCtx_00;
  int iVar1;
  char *pcVar2;
  char *local_78;
  int local_5c;
  char *pcStack_58;
  int nTaglen;
  char *zTaglist;
  jx9_int64 nLen;
  jx9_int64 n;
  io_private *pDev;
  char *zLine;
  jx9_io_stream *pStream;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pStream = (jx9_io_stream *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((nArg < 1) || (iVar1 = jx9_value_is_resource(*apArg), iVar1 == 0)) {
    jx9_context_throw_error(pjStack_18,2,"Expecting an IO handle");
    jx9_result_bool(pjStack_18,0);
  }
  else {
    n = (jx9_int64)jx9_value_to_resource((jx9_value *)pStream->zName);
    pCtx_00 = pjStack_18;
    if (((long *)n == (long *)0x0) || (*(int *)(n + 0x34) != 0xfeac14)) {
      jx9_context_throw_error(pjStack_18,2,"Expecting an IO handle");
      jx9_result_bool(pjStack_18,0);
    }
    else {
      zLine = *(char **)n;
      if (zLine == (char *)0x0) {
        pcVar2 = jx9_function_name(pjStack_18);
        if (zLine == (char *)0x0) {
          local_78 = "null_stream";
        }
        else {
          local_78 = *(char **)zLine;
        }
        jx9_context_throw_error_format
                  (pCtx_00,2,
                   "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
                   ,pcVar2,local_78);
        jx9_result_bool(pjStack_18,0);
      }
      else {
        zTaglist = (char *)0xffffffffffffffff;
        if (1 < apArg_local._4_4_) {
          zTaglist = (char *)jx9_value_to_int64(*(jx9_value **)&pStream->iVersion);
        }
        nLen = StreamReadLine((io_private *)n,(char **)&pDev,(jx9_int64)zTaglist);
        if (nLen < 1) {
          jx9_result_bool(pjStack_18,0);
        }
        else {
          pcStack_58 = (char *)0x0;
          local_5c = 0;
          if ((2 < apArg_local._4_4_) &&
             (iVar1 = jx9_value_is_string((jx9_value *)pStream->xOpen), iVar1 != 0)) {
            pcStack_58 = jx9_value_to_string((jx9_value *)pStream->xOpen,&local_5c);
          }
          jx9StripTagsFromString(pjStack_18,(char *)pDev,(int)nLen,pcStack_58,local_5c);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_fgetss(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	const char *zLine;
	io_private *pDev;
	jx9_int64 n, nLen;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	nLen = -1;
	if( nArg > 1 ){
		/* Maximum data to read */
		nLen = jx9_value_to_int64(apArg[1]);
	}
	/* Perform the requested operation */
	n = StreamReadLine(pDev, &zLine, nLen);
	if( n < 1 ){
		/* EOF or IO error, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		const char *zTaglist = 0;
		int nTaglen = 0;
		if( nArg > 2 && jx9_value_is_string(apArg[2]) ){
			/* Allowed tag */
			zTaglist = jx9_value_to_string(apArg[2], &nTaglen);
		}
		/* Process data just read */
		jx9StripTagsFromString(pCtx, zLine, (int)n, zTaglist, nTaglen);
	}
	return JX9_OK;	
}